

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O0

int ecjpake_ecp_add3(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *A,
                    mbedtls_ecp_point *B,mbedtls_ecp_point *C)

{
  undefined1 local_48 [8];
  mbedtls_mpi one;
  int ret;
  mbedtls_ecp_point *C_local;
  mbedtls_ecp_point *B_local;
  mbedtls_ecp_point *A_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  one._12_4_ = 0xffffff92;
  mbedtls_mpi_init((mbedtls_mpi *)local_48);
  one._12_4_ = mbedtls_mpi_lset((mbedtls_mpi *)local_48,1);
  if ((one._12_4_ == 0) &&
     (one._12_4_ = mbedtls_ecp_muladd(grp,R,(mbedtls_mpi *)local_48,A,(mbedtls_mpi *)local_48,B),
     one._12_4_ == 0)) {
    one._12_4_ = mbedtls_ecp_muladd(grp,R,(mbedtls_mpi *)local_48,R,(mbedtls_mpi *)local_48,C);
  }
  mbedtls_mpi_free((mbedtls_mpi *)local_48);
  return one._12_4_;
}

Assistant:

static int ecjpake_ecp_add3(mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                            const mbedtls_ecp_point *A,
                            const mbedtls_ecp_point *B,
                            const mbedtls_ecp_point *C)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi one;

    mbedtls_mpi_init(&one);

    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&one, 1));
    MBEDTLS_MPI_CHK(mbedtls_ecp_muladd(grp, R, &one, A, &one, B));
    MBEDTLS_MPI_CHK(mbedtls_ecp_muladd(grp, R, &one, R, &one, C));

cleanup:
    mbedtls_mpi_free(&one);

    return ret;
}